

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O1

int Dch_NodesAreEqual(void *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = *(uint *)((long)p + 4);
  if (((1 < (int)uVar2) && ((uint)pObj0->Id < uVar2)) && ((uint)pObj1->Id < uVar2)) {
    plVar1 = *(long **)((long)p + 8);
    uVar2 = (uint)((ulong)(plVar1[1] - *plVar1) >> 2);
    if (((*(uint *)&pObj1->field_0x18 ^ *(uint *)&pObj0->field_0x18) & 8) == 0) {
      if (0 < (int)uVar2) {
        uVar3 = 0;
        do {
          if (*(int *)(plVar1[(uint)pObj0->Id] + uVar3 * 4) !=
              *(int *)(plVar1[(uint)pObj1->Id] + uVar3 * 4)) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while ((uVar2 & 0x7fffffff) != uVar3);
      }
    }
    else if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        if ((*(uint *)(plVar1[(uint)pObj1->Id] + uVar3 * 4) ^
            *(uint *)(plVar1[(uint)pObj0->Id] + uVar3 * 4)) != 0xffffffff) {
          return 0;
        }
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
    return 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Dch_NodesAreEqual( void * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim0, * pSim1;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim0 = Dch_ObjSim( vSims, pObj0 );
    pSim1 = Dch_ObjSim( vSims, pObj1 );
    if ( pObj0->fPhase != pObj1->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != ~pSim1[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != pSim1[k] )
                return 0;
    }
    return 1;
}